

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_>::
recomputeIfPopulated(ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  CanonicalDataSource CVar1;
  long in_RDI;
  ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *in_stack_00000008;
  string *in_stack_00000010;
  ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *in_stack_ffffffffffffffb0;
  undefined1 local_29 [41];
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    in_stack_ffffffffffffffb0 =
         (ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *)local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_29 + 1),
               "called recomputeIfPopulated() on buffer which does not get computed",
               (allocator *)in_stack_ffffffffffffffb0);
    exception(in_stack_00000010);
    std::__cxx11::string::~string((string *)(local_29 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_29);
  }
  CVar1 = currentCanonicalDataSource(in_stack_00000008);
  if (CVar1 != NeedsCompute) {
    invalidateHostBuffer((ManagedBuffer<glm::vec<2,_unsigned_int,_(glm::qualifier)0>_> *)0x42a6e1);
    std::function<void_()>::operator()((function<void_()> *)in_stack_ffffffffffffffb0);
    markHostBufferUpdated(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void ManagedBuffer<T>::recomputeIfPopulated() {
  if (!dataGetsComputed) { // sanity check
    exception("called recomputeIfPopulated() on buffer which does not get computed");
  }

  // if not populated, quick out
  if (currentCanonicalDataSource() == CanonicalDataSource::NeedsCompute) {
    return;
  }

  invalidateHostBuffer();
  computeFunc();
  markHostBufferUpdated();
}